

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blech32.c
# Opt level: O1

int blech32_addr_decode(int *witver,uint8_t *witdata,size_t *witdata_len,char *hrp,char *addr)

{
  char cVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  uint64_t uVar6;
  char *pcVar7;
  bool bVar8;
  uint uVar9;
  ulong uVar10;
  ulong pre;
  char *pcVar11;
  char *pcVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  char hrp_actual [1000];
  uint8_t data [1000];
  char local_808 [1008];
  byte local_418 [1000];
  
  pcVar5 = (char *)strlen(addr);
  bVar8 = true;
  pcVar12 = hrp;
  if ((char *)0xfffffffffffffc1e < pcVar5 + -0x3e9) {
    if (pcVar5 == (char *)0x0) {
      pcVar12 = (char *)0x0;
    }
    else {
      pcVar7 = pcVar5 + (long)addr;
      pcVar11 = (char *)0x0;
      do {
        pcVar7 = pcVar7 + -1;
        pcVar12 = pcVar11;
        if (*pcVar7 == '1') break;
        pcVar11 = pcVar11 + 1;
        pcVar12 = pcVar5;
      } while (pcVar5 != pcVar11);
    }
    pcVar7 = pcVar12 + 1;
    uVar10 = (long)pcVar5 - (long)pcVar7;
    if (&DAT_0000000b < pcVar12 && (pcVar7 <= pcVar5 && uVar10 != 0)) {
      lVar13 = uVar10 + (uVar10 == 0);
      pre = 1;
      bVar3 = false;
      bVar8 = false;
      lVar15 = 0;
      do {
        lVar14 = lVar15;
        cVar1 = addr[lVar14];
        uVar9 = (uint)cVar1;
        if ((byte)(cVar1 - 0x21U) < 0x5e) {
          if ((byte)(cVar1 + 0x9fU) < 0x1a) {
            bVar8 = true;
          }
          else if ((byte)(cVar1 + 0xbfU) < 0x1a) {
            bVar3 = true;
            uVar9 = uVar9 | 0x20;
          }
          local_808[lVar14] = (char)uVar9;
          uVar6 = blech32_polymod_step(pre);
          pre = uVar9 >> 5 ^ uVar6;
        }
        if (0x5d < (byte)(cVar1 - 0x21U)) goto LAB_004b0612;
        lVar15 = lVar14 + 1;
      } while (lVar13 != lVar14 + 1);
      local_808[lVar14 + 1] = '\0';
      uVar6 = blech32_polymod_step(pre);
      pcVar11 = (char *)0x1;
      if (pcVar5 != pcVar7) {
        lVar15 = 0;
        do {
          uVar6 = blech32_polymod_step(uVar6);
          uVar6 = (byte)addr[lVar15] & 0x1f ^ uVar6;
          lVar15 = lVar15 + 1;
        } while (lVar13 != lVar15);
        pcVar11 = (char *)(lVar13 + 1);
      }
      do {
        if (pcVar5 <= pcVar11) {
          bVar8 = uVar6 != 1 || bVar3 && bVar8;
          pcVar12 = pcVar12 + -0xc;
          goto LAB_004b063b;
        }
        cVar1 = addr[(long)pcVar11];
        if ((long)cVar1 < 0) {
          iVar4 = -1;
        }
        else {
          iVar4 = (int)blech32_charset_rev[cVar1];
        }
        if ((byte)(cVar1 + 0x9fU) < 0x1a) {
          bVar8 = true;
        }
        if ((byte)(cVar1 + 0xbfU) < 0x1a) {
          bVar3 = true;
        }
        if (iVar4 != -1) {
          uVar6 = blech32_polymod_step(uVar6);
          if (pcVar11 + 0xc < pcVar5) {
            (local_418 + ~uVar10)[(long)pcVar11] = (byte)iVar4;
          }
          uVar6 = uVar6 ^ (long)iVar4;
          pcVar11 = pcVar11 + 1;
        }
      } while (iVar4 != -1);
LAB_004b0612:
      bVar8 = true;
      pcVar12 = pcVar12 + -0xc;
    }
  }
LAB_004b063b:
  if (((!bVar8) && ((char *)0xfffffffffffffc1b < pcVar12 + -0x3e5)) &&
     (iVar4 = strncmp(hrp,local_808,0x3e3), local_418[0] < 0x11 && iVar4 == 0)) {
    *witdata_len = 0;
    iVar4 = blech32_convert_bits
                      (witdata,witdata_len,8,(uint8_t *)((long)local_418 + 1),(size_t)(pcVar12 + -1)
                       ,5,0);
    if (((iVar4 != 0) && (sVar2 = *witdata_len, 0xffffffffffffffbf < sVar2 - 0x42)) &&
       ((local_418[0] != 0 || ((sVar2 == 0x41 || (sVar2 == 0x35)))))) {
      *witver = (uint)local_418[0];
      return 1;
    }
  }
  wally_clear_2(local_418,1000,local_808,1000);
  return 0;
}

Assistant:

static int blech32_addr_decode(int *witver, uint8_t *witdata, size_t *witdata_len, const char *hrp, const char *addr) {
    uint8_t data[WALLY_BLECH32_MAXLEN];
    char hrp_actual[WALLY_BLECH32_MAXLEN];
    size_t data_len;
    if (!blech32_decode(hrp_actual, data, &data_len, addr, WALLY_BLECH32_MAXLEN)) goto fail;
    if (data_len == 0 || data_len > (WALLY_BLECH32_MAXLEN - 4)) goto fail;
    if (strncmp(hrp, hrp_actual, WALLY_BLECH32_MAXLEN - 5) != 0) goto fail;
    if (data[0] > 16) goto fail;
    *witdata_len = 0;
    if (!blech32_convert_bits(witdata, witdata_len, 8, data + 1, data_len - 1, 5, 0)) goto fail;
    if (*witdata_len < 2 || *witdata_len > 65) goto fail;
    if (data[0] == 0 && *witdata_len != 53 && *witdata_len != 65) goto fail;
    *witver = data[0];
    return 1;
fail:
    wally_clear_2(data, sizeof(data), hrp_actual, sizeof(hrp_actual));
    return 0;
}